

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O1

int dwarf_highpc_b(Dwarf_Die die,Dwarf_Addr *return_value,Dwarf_Half *return_form,
                  Dwarf_Form_Class *return_class,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Debug dbg;
  Dwarf_Half DVar3;
  int iVar4;
  Dwarf_Bool DVar5;
  int iVar6;
  long lVar7;
  Dwarf_Signed errval;
  uint form;
  bool bVar8;
  Dwarf_Half attr_form;
  Dwarf_Unsigned addr_out;
  Dwarf_Unsigned index_to_addr;
  Dwarf_Byte_Ptr info_ptr;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Half local_7a;
  Dwarf_Unsigned local_78;
  Dwarf_Byte_Ptr local_70;
  Dwarf_Small *local_68;
  Dwarf_Byte_Ptr local_60;
  Dwarf_Form_Class local_54;
  ulong local_50;
  Dwarf_Form_Class *local_48;
  Dwarf_Unsigned local_40 [2];
  
  local_60 = (Dwarf_Small *)0x0;
  local_7a = 0;
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
LAB_001830f3:
    _dwarf_error((Dwarf_Debug)0x0,error,errval);
    return 1;
  }
  pDVar2 = die->di_cu_context;
  if (pDVar2 == (Dwarf_CU_Context_conflict)0x0) {
    errval = 0x68;
    goto LAB_001830f3;
  }
  dbg = pDVar2->cc_dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  local_50 = (ulong)pDVar2->cc_address_size;
  local_48 = return_class;
  iVar4 = _dwarf_get_value_ptr(die,0x12,&local_7a,&local_60,(Dwarf_Signed *)0x0,error);
  DVar3 = local_7a;
  if (iVar4 == -1) {
    return -1;
  }
  if (iVar4 == 1) {
    return 1;
  }
  pDVar2 = die->di_cu_context;
  lVar7 = 0x138;
  if (pDVar2->cc_is_info == 0) {
    lVar7 = 0x200;
  }
  local_68 = (Dwarf_Small *)
             ((ulong)pDVar2->cc_extension_size + (ulong)pDVar2->cc_length_size +
             *(long *)((long)&pDVar2->cc_dbg->de_magic + lVar7) + pDVar2->cc_debug_offset +
             pDVar2->cc_length);
  form = (uint)local_7a;
  local_54 = dwarf_get_form_class
                       (pDVar2->cc_version_stamp,0x12,(ushort)pDVar2->cc_length_size,local_7a);
  if (local_54 != DW_FORM_CLASS_ADDRESS) {
    local_78 = 0;
    iVar4 = _dwarf_die_attr_unsigned_constant(die,0x12,&local_78,error);
    if (iVar4 == 0) {
      *return_value = local_78;
LAB_001831df:
      iVar4 = 1;
      bVar8 = true;
    }
    else {
      local_70 = (Dwarf_Byte_Ptr)0x0;
      iVar4 = _dwarf_get_value_ptr(die,0x12,&local_7a,&local_70,(Dwarf_Signed *)0x0,error);
      if (iVar4 != -1) {
        bVar8 = false;
        if (iVar4 == 1) goto joined_r0x00183293;
        if (local_7a == 0xd) {
          local_40[1] = 0;
          local_40[0] = 0;
          iVar6 = dwarf_decode_leb128((char *)local_70,local_40 + 1,local_40,(char *)local_68);
          bVar8 = iVar6 != 1;
          if (iVar6 == 1) {
            _dwarf_error_string(dbg,error,0x149,
                                "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
            local_40[0] = 0;
          }
          iVar4 = 1;
          if (iVar6 == 1) goto joined_r0x00183293;
          *return_value = local_40[0];
          goto LAB_001831df;
        }
        _dwarf_error(dbg,error,0x18d);
        iVar4 = 1;
      }
      bVar8 = false;
    }
    goto joined_r0x00183293;
  }
  DVar5 = dwarf_addr_form_is_indexed(form);
  if (DVar5 == 0) {
    iVar4 = 1;
LAB_00183214:
    local_78 = 0;
    pDVar1 = local_60 + local_50;
    if (local_68 < pDVar1) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      iVar4 = 1;
      local_78 = 0;
    }
    else {
      (*dbg->de_copy_word)(&local_78,local_60,local_50);
    }
    if (pDVar1 <= local_68) {
      *return_value = local_78;
      bVar8 = true;
      goto joined_r0x00183293;
    }
  }
  else {
    local_78 = 0;
    local_70 = (Dwarf_Byte_Ptr)0x0;
    pDVar2 = die->di_cu_context;
    iVar4 = _dwarf_get_addr_index_itself
                      ((uint)DVar3,local_60,dbg,pDVar2,(Dwarf_Unsigned *)&local_70,error);
    if (iVar4 == 0) {
      iVar4 = _dwarf_look_in_local_and_tied_by_index
                        (dbg,pDVar2,(Dwarf_Unsigned)local_70,&local_78,error);
      bVar8 = iVar4 == 0;
      iVar4 = iVar4 + (uint)(iVar4 == 0);
    }
    else {
      bVar8 = false;
    }
    if (bVar8) goto LAB_00183214;
  }
  bVar8 = false;
joined_r0x00183293:
  if (!bVar8) {
    return iVar4;
  }
  if (return_form != (Dwarf_Half *)0x0) {
    *return_form = local_7a;
  }
  if (local_48 != (Dwarf_Form_Class *)0x0) {
    *local_48 = local_54;
    return 0;
  }
  return 0;
}

Assistant:

int
dwarf_highpc_b(Dwarf_Die die,
    Dwarf_Addr *return_value,
    Dwarf_Half *return_form,
    enum Dwarf_Form_Class *return_class,
    Dwarf_Error *error)
{
    Dwarf_Byte_Ptr info_ptr = 0;
    Dwarf_Half attr_form = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Half address_size = 0;
    Dwarf_Half offset_size = 0;
    enum Dwarf_Form_Class class = DW_FORM_CLASS_UNKNOWN;
    Dwarf_Half version = 0;
    Dwarf_Byte_Ptr die_info_end = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    address_size = die->di_cu_context->cc_address_size;

    res = _dwarf_get_value_ptr(die, DW_AT_high_pc,
        &attr_form,&info_ptr,0,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    die_info_end = _dwarf_calculate_info_section_end_ptr(
        die->di_cu_context);

    version = die->di_cu_context->cc_version_stamp;
    offset_size = die->di_cu_context->cc_length_size;
    class = dwarf_get_form_class(version,DW_AT_high_pc,
        offset_size,attr_form);

    if (class == DW_FORM_CLASS_ADDRESS) {
        Dwarf_Addr addr = 0;
        if (dwarf_addr_form_is_indexed(attr_form)) {
            Dwarf_Unsigned addr_out = 0;
            Dwarf_Unsigned index_to_addr = 0;
            int res2 = 0;
            Dwarf_CU_Context context = die->di_cu_context;

            /*  index_to_addr we get here might apply
                to this dbg or to tieddbg. */
            /* error is returned on dbg, not tied */
            res2 = _dwarf_get_addr_index_itself(attr_form,
                info_ptr,dbg,context,&index_to_addr,error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
            res2= _dwarf_look_in_local_and_tied_by_index(dbg,
                context,
                index_to_addr,
                &addr_out,
                error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
        }
        READ_UNALIGNED_CK(dbg, addr, Dwarf_Addr,
            info_ptr, address_size,
            error,die_info_end);
        *return_value = addr;
    } else {
        int res3 = 0;
        Dwarf_Unsigned v = 0;
        res3 = _dwarf_die_attr_unsigned_constant(die,DW_AT_high_pc,
            &v,error);
        if (res3 != DW_DLV_OK) {
            Dwarf_Byte_Ptr info_ptr2 = 0;

            res3 = _dwarf_get_value_ptr(die, DW_AT_high_pc,
                &attr_form,&info_ptr2,0,error);
            if (res3 == DW_DLV_ERROR) {
                return res3;
            }
            if (res3 == DW_DLV_NO_ENTRY) {
                return res3;
            }
            if (attr_form == DW_FORM_sdata) {
                Dwarf_Signed sval = 0;

                /*  DWARF4 defines the value as an unsigned offset
                    in section 2.17.2. */
                DECODE_LEB128_UWORD_CK(info_ptr2, sval,
                    dbg,error,die_info_end);
                *return_value = (Dwarf_Unsigned)sval;
            } else {
                _dwarf_error(dbg, error, DW_DLE_HIGHPC_WRONG_FORM);
                return DW_DLV_ERROR;
            }
        } else {
            *return_value = v;
        }
    }
    /*  Allow null args starting 22 April 2019. */
    if (return_form) {
        *return_form = attr_form;
    }
    if (return_class) {
        *return_class = class;
    }
    return DW_DLV_OK;
}